

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

BOOL __thiscall Js::TypedArrayBase::IsConfigurable(TypedArrayBase *this,PropertyId propertyId)

{
  BOOL BVar1;
  ScriptContext *this_00;
  uint32 local_20;
  PropertyId local_1c;
  uint32 index;
  PropertyId propertyId_local;
  TypedArrayBase *this_local;
  
  local_20 = 0;
  local_1c = propertyId;
  _index = this;
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  BVar1 = ScriptContext::IsNumericPropertyId(this_00,local_1c,&local_20);
  if (BVar1 == 0) {
    this_local._4_4_ = DynamicObject::IsConfigurable((DynamicObject *)this,local_1c);
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

BOOL TypedArrayBase::IsConfigurable(PropertyId propertyId)
    {
        uint32 index = 0;
        if (GetScriptContext()->IsNumericPropertyId(propertyId, &index))
        {
            return false;
        }
        return DynamicObject::IsConfigurable(propertyId);
    }